

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionAnalyzer.cpp
# Opt level: O2

bool wasm::ExpressionAnalyzer::isResultUsed(ExpressionStack *stack,Function *func)

{
  Id IVar1;
  pointer ppEVar2;
  Expression *this;
  Expression *pEVar3;
  Expression **ppEVar4;
  If *pIVar5;
  Block *pBVar6;
  Expression **ppEVar7;
  uint uVar8;
  char *__assertion;
  size_t j;
  ulong index;
  Signature SVar9;
  
  uVar8 = ((int)((ulong)((long)(stack->flexible).
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(stack->flexible).
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) +
          (int)stack->usedFixed) - 2;
  do {
    if ((int)uVar8 < 0) {
      SVar9 = HeapType::getSignature(&func->type);
      return SVar9.results.id.id != 0;
    }
    ppEVar2 = (stack->flexible).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppEVar7 = ppEVar2 + ((ulong)uVar8 - 10);
    if (uVar8 < 10) {
      ppEVar7 = (stack->fixed)._M_elems + uVar8;
    }
    ppEVar4 = ppEVar2 + ((ulong)uVar8 - 9);
    if (uVar8 < 9) {
      ppEVar4 = (stack->fixed)._M_elems + (ulong)uVar8 + 1;
    }
    this = *ppEVar7;
    pEVar3 = *ppEVar4;
    IVar1 = this->_id;
    if (IVar1 == BlockId) {
      pBVar6 = Expression::cast<wasm::Block>(this);
      index = 0;
      while (index < (pBVar6->list).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                     usedElements - 1) {
        ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(pBVar6->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,index);
        index = index + 1;
        if (*ppEVar7 == pEVar3) {
          return false;
        }
      }
      ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          (&(pBVar6->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
      if (*ppEVar7 != pEVar3) {
        __assertion = "block->list.back() == above";
        uVar8 = 0x2b;
LAB_0089b1f7:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ExpressionAnalyzer.cpp"
                      ,uVar8,
                      "static bool wasm::ExpressionAnalyzer::isResultUsed(ExpressionStack &, Function *)"
                     );
      }
    }
    else {
      if (IVar1 != IfId) {
        if (IVar1 == DropId) {
          return false;
        }
        return true;
      }
      pIVar5 = Expression::cast<wasm::If>(this);
      if (pEVar3 == pIVar5->condition) {
        return true;
      }
      if (pIVar5->ifFalse == (Expression *)0x0) {
        return false;
      }
      if ((pEVar3 != pIVar5->ifFalse) && (pEVar3 != pIVar5->ifTrue)) {
        __assertion = "above == iff->ifTrue || above == iff->ifFalse";
        uVar8 = 0x35;
        goto LAB_0089b1f7;
      }
    }
    uVar8 = uVar8 - 1;
  } while( true );
}

Assistant:

bool ExpressionAnalyzer::isResultUsed(ExpressionStack& stack, Function* func) {
  for (int i = int(stack.size()) - 2; i >= 0; i--) {
    auto* curr = stack[i];
    auto* above = stack[i + 1];
    // only if and block can drop values (pre-drop expression was added) FIXME
    if (curr->is<Block>()) {
      auto* block = curr->cast<Block>();
      for (size_t j = 0; j < block->list.size() - 1; j++) {
        if (block->list[j] == above) {
          return false;
        }
      }
      assert(block->list.back() == above);
      // continue down
    } else if (curr->is<If>()) {
      auto* iff = curr->cast<If>();
      if (above == iff->condition) {
        return true;
      }
      if (!iff->ifFalse) {
        return false;
      }
      assert(above == iff->ifTrue || above == iff->ifFalse);
      // continue down
    } else {
      if (curr->is<Drop>()) {
        return false;
      }
      return true; // all other node types use the result
    }
  }
  // The value might be used, so it depends on if the function returns
  return func->getResults() != Type::none;
}